

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

Am_Priority_List * __thiscall
Am_Priority_List::Add
          (Am_Priority_List *this,Am_Object *obj,float main_priority,int second_priority,
          int third_priority)

{
  Am_Priority_List_Item *this_00;
  Am_Priority_List_Item *item;
  int third_priority_local;
  int second_priority_local;
  float main_priority_local;
  Am_Object *obj_local;
  Am_Priority_List *this_local;
  
  this_00 = (Am_Priority_List_Item *)operator_new(0x28);
  Am_Priority_List_Item::Am_Priority_List_Item(this_00);
  Am_Object::operator=((Am_Object *)this_00,obj);
  this_00->main_priority = main_priority;
  this_00->second_priority = second_priority;
  this_00->third_priority = third_priority;
  insert_item_at_right_place(this,this_00);
  this->number = this->number + 1;
  return this;
}

Assistant:

Am_Priority_List *
Am_Priority_List::Add(Am_Object obj, float main_priority, int second_priority,
                      int third_priority)
{
  Am_Priority_List_Item *item = new Am_Priority_List_Item;
  item->obj = obj;
  item->main_priority = main_priority;
  item->second_priority = second_priority;
  item->third_priority = third_priority;
  this->insert_item_at_right_place(item);
  number++;
  return this;
}